

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeWriter.h
# Opt level: O2

void __thiscall CodeWriter::CodeWriter(CodeWriter *this)

{
  allocator local_51;
  allocator local_50;
  allocator local_4f;
  allocator local_4e;
  allocator local_4d;
  allocator local_4c;
  allocator local_4b;
  allocator local_4a;
  allocator local_49;
  string *local_48;
  string *local_40;
  string *local_38;
  
  (this->moonOutput)._M_dataplus._M_p = (pointer)&(this->moonOutput).field_2;
  (this->moonOutput)._M_string_length = 0;
  (this->moonOutput).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&this->tab,"\t",&local_49);
  local_38 = &this->tab;
  std::__cxx11::string::string((string *)&this->newLine,"\n",&local_4a);
  local_40 = &this->newLine;
  std::__cxx11::string::string((string *)&this->comma,",",&local_4b);
  local_48 = &this->comma;
  std::__cxx11::string::string((string *)&this->loadOp,"lw ",&local_4c);
  std::__cxx11::string::string((string *)&this->saveOp,"sw ",&local_4d);
  std::__cxx11::string::string((string *)&this->entry,"entry",&local_4e);
  std::__cxx11::string::string((string *)&this->halt,"hlt",&local_4f);
  std::__cxx11::string::string((string *)&this->nop,"nop",&local_50);
  std::__cxx11::string::string((string *)&this->initStackPointer,"addi\tr14,r0,topaddr",&local_51);
  (this->tags)._M_h._M_buckets = &(this->tags)._M_h._M_single_bucket;
  (this->tags)._M_h._M_bucket_count = 1;
  (this->tags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags)._M_h._M_element_count = 0;
  (this->tags)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

CodeWriter() = default;